

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.h
# Opt level: O1

void __thiscall
booster::locale::basic_message<wchar_t>::basic_message
          (basic_message<wchar_t> *this,basic_message<wchar_t> *other)

{
  pointer pwVar1;
  
  this->n_ = other->n_;
  this->c_id_ = other->c_id_;
  this->c_context_ = other->c_context_;
  this->c_plural_ = other->c_plural_;
  (this->id_)._M_dataplus._M_p = (pointer)&(this->id_).field_2;
  pwVar1 = (other->id_)._M_dataplus._M_p;
  std::__cxx11::wstring::_M_construct<wchar_t*>
            ((wstring *)&this->id_,pwVar1,pwVar1 + (other->id_)._M_string_length);
  (this->context_)._M_dataplus._M_p = (pointer)&(this->context_).field_2;
  pwVar1 = (other->context_)._M_dataplus._M_p;
  std::__cxx11::wstring::_M_construct<wchar_t*>
            ((wstring *)&this->context_,pwVar1,pwVar1 + (other->context_)._M_string_length);
  (this->plural_)._M_dataplus._M_p = (pointer)&(this->plural_).field_2;
  pwVar1 = (other->plural_)._M_dataplus._M_p;
  std::__cxx11::wstring::_M_construct<wchar_t*>
            ((wstring *)&this->plural_,pwVar1,pwVar1 + (other->plural_)._M_string_length);
  return;
}

Assistant:

basic_message(basic_message const &other) :
                n_(other.n_),
                c_id_(other.c_id_),
                c_context_(other.c_context_),
                c_plural_(other.c_plural_),
                id_(other.id_),
                context_(other.context_),
                plural_(other.plural_)
            {
            }